

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O0

void Abc_NtkConvertDcLatches(Abc_Ntk_t *pNtk)

{
  Nm_Man_t *p;
  bool bVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  char *pcVar6;
  Abc_Obj_t *pNodeTo;
  Abc_Obj_t *pNodeFrom;
  uint local_40;
  int Counter;
  int fFound;
  int i;
  Abc_InitType_t Init;
  Abc_Obj_t *pPi;
  Abc_Obj_t *pMux;
  Abc_Obj_t *pLatch;
  Abc_Obj_t *pCtrl;
  Abc_Ntk_t *pNtk_local;
  
  bVar1 = false;
  Counter = 0;
  do {
    iVar2 = Vec_PtrSize(pNtk->vBoxes);
    if (iVar2 <= Counter) {
LAB_00aea769:
      if (bVar1) {
        pAVar3 = Abc_NtkCreateNodeConst1(pNtk);
        pAVar3 = Abc_NtkAddLatch(pNtk,pAVar3,ABC_INIT_ZERO);
        local_40 = 0;
        for (Counter = 0; iVar2 = Vec_PtrSize(pNtk->vBoxes), Counter < iVar2; Counter = Counter + 1)
        {
          pAVar4 = Abc_NtkBox(pNtk,Counter);
          iVar2 = Abc_ObjIsLatch(pAVar4);
          if ((iVar2 != 0) && (iVar2 = Abc_LatchIsInitDc(pAVar4), iVar2 != 0)) {
            pAVar4->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
            pAVar5 = Abc_ObjFanout0(pAVar4);
            pAVar5 = Abc_NodeFindCoFanout(pAVar5);
            if (pAVar5 != (Abc_Obj_t *)0x0) {
              p = pAVar4->pNtk->pManName;
              pAVar5 = Abc_ObjFanout0(pAVar4);
              Nm_ManDeleteIdName(p,pAVar5->Id);
              pAVar5 = Abc_ObjFanout0(pAVar4);
              pcVar6 = Abc_ObjName(pAVar4);
              Abc_ObjAssignName(pAVar5,pcVar6,"_lo");
            }
            pAVar5 = Abc_NtkCreatePi(pNtk);
            pcVar6 = Abc_ObjName(pAVar4);
            Abc_ObjAssignName(pAVar5,pcVar6,"_pi");
            pNodeTo = Abc_NtkCreateNode(pNtk);
            pNodeFrom = Abc_ObjFanout0(pAVar4);
            Abc_ObjTransferFanout(pNodeFrom,pNodeTo);
            pAVar4 = Abc_ObjFanout0(pAVar4);
            Abc_NtkNodeConvertToMux(pNtk,pAVar3,pAVar4,pAVar5,pNodeTo);
            local_40 = local_40 + 1;
          }
        }
        printf("The number of converted latches with DC values = %d.\n",(ulong)local_40);
      }
      return;
    }
    pAVar3 = Abc_NtkBox(pNtk,Counter);
    iVar2 = Abc_ObjIsLatch(pAVar3);
    if ((iVar2 != 0) && (iVar2 = Abc_LatchIsInitDc(pAVar3), iVar2 != 0)) {
      bVar1 = true;
      goto LAB_00aea769;
    }
    Counter = Counter + 1;
  } while( true );
}

Assistant:

void Abc_NtkConvertDcLatches( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pCtrl, * pLatch, * pMux, * pPi;
    Abc_InitType_t Init = ABC_INIT_ZERO;
    int i, fFound = 0, Counter;
    // check if there are latches with DC values
    Abc_NtkForEachLatch( pNtk, pLatch, i )
        if ( Abc_LatchIsInitDc(pLatch) )
        {
            fFound = 1;
            break;
        }
    if ( !fFound )
        return;
    // add control latch
    pCtrl = Abc_NtkAddLatch( pNtk, Abc_NtkCreateNodeConst1(pNtk), Init );
    // add fanouts for each latch with DC values
    Counter = 0;
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
        if ( !Abc_LatchIsInitDc(pLatch) )
            continue;
        // change latch value
        pLatch->pData = (void *)Init;
        // if the latch output has the same name as a PO, rename it
        if ( Abc_NodeFindCoFanout( Abc_ObjFanout0(pLatch) ) )
        {
            Nm_ManDeleteIdName( pLatch->pNtk->pManName, Abc_ObjFanout0(pLatch)->Id );
            Abc_ObjAssignName( Abc_ObjFanout0(pLatch), Abc_ObjName(pLatch), "_lo" );
        }
        // create new PIs
        pPi = Abc_NtkCreatePi( pNtk );
        Abc_ObjAssignName( pPi, Abc_ObjName(pLatch), "_pi" );
        // create a new node and transfer fanout from latch output to the new node
        pMux = Abc_NtkCreateNode( pNtk );
        Abc_ObjTransferFanout( Abc_ObjFanout0(pLatch), pMux );
        // convert the node into a mux
        Abc_NtkNodeConvertToMux( pNtk, pCtrl, Abc_ObjFanout0(pLatch), pPi, pMux );
        Counter++;
    }
    printf( "The number of converted latches with DC values = %d.\n", Counter );
}